

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr * __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler>::
ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler> *this)

{
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  TestNLHandler *this_01;
  int opcode;
  double dVar2;
  
  this_00 = *(TextReader<fmt::Locale> **)this;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    this_01 = *(TestNLHandler **)(this + 0x10);
    dVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadConstant
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *)this,
                       *pcVar1);
    TestNLHandler::OnBool_abi_cxx11_(__return_storage_ptr__,this_01,(bool)(-(dVar2 != 0.0) & 1));
    break;
  default:
    TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x2148be);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    break;
  case 'o':
    opcode = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadOpCode
                       ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *)this);
    ReadLogicalExpr_abi_cxx11_(__return_storage_ptr__,this,opcode);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}